

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  U32 lowestValid;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong *puVar16;
  int iVar17;
  ulong *puVar18;
  BYTE *litEnd;
  ulong *ip;
  ulong *puVar19;
  ulong *puVar20;
  BYTE *pBVar21;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_90;
  ulong *local_88;
  ulong *local_80;
  ulong *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  BYTE *local_58;
  ulong *local_50;
  ulong *local_48;
  ulong *local_40;
  uint *local_38;
  
  puVar16 = (ulong *)((long)src + srcSize);
  pBVar21 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  local_58 = pBVar21 + uVar15;
  uVar14 = (ms->cParams).minMatch;
  uVar9 = 6;
  if (uVar14 < 6) {
    uVar9 = uVar14;
  }
  local_60 = 4;
  if (4 < uVar9) {
    local_60 = uVar9;
  }
  local_64 = *rep;
  ip = (ulong *)((ulong)((int)src == (int)local_58) + (long)src);
  iVar17 = (int)ip - (int)pBVar21;
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_68 = iVar17 - uVar14;
  if (iVar17 - uVar15 <= uVar14) {
    local_68 = uVar15;
  }
  if (ms->loadedDictEnd != 0) {
    local_68 = uVar15;
  }
  local_6c = rep[1];
  local_68 = iVar17 - local_68;
  uVar15 = local_6c;
  if (local_68 < local_6c) {
    uVar15 = 0;
  }
  uVar14 = local_64;
  if (local_68 < local_64) {
    uVar14 = 0;
  }
  uVar7 = (ulong)uVar14;
  local_78 = (ulong *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_38 = rep;
  if (ip < local_78) {
    puVar18 = (ulong *)((long)puVar16 + -7);
    local_48 = (ulong *)((long)puVar16 + -3);
    local_50 = (ulong *)((long)puVar16 + -1);
    local_40 = puVar16 + -4;
    uVar8 = (ulong)uVar15;
    local_88 = puVar18;
    local_80 = puVar16;
    do {
      uVar12 = uVar7;
      if (((int)uVar7 == 0) || (*(int *)(((long)ip + 1) - uVar7) != *(int *)((long)ip + 1))) {
        local_90 = 999999999;
        if (local_60 == 6) {
          uVar13 = ZSTD_HcFindBestMatch_noDict_6(ms,(BYTE *)ip,(BYTE *)puVar16,&local_90);
        }
        else if (local_60 == 5) {
          uVar13 = ZSTD_HcFindBestMatch_noDict_5(ms,(BYTE *)ip,(BYTE *)puVar16,&local_90);
        }
        else {
          uVar13 = ZSTD_HcFindBestMatch_noDict_4(ms,(BYTE *)ip,(BYTE *)puVar16,&local_90);
        }
        uVar10 = 1;
        if (uVar13 != 0) {
          uVar10 = local_90;
        }
        puVar16 = local_80;
        puVar18 = local_88;
        if (3 < uVar13) {
          if (3 < uVar10) {
            if ((src < ip) && (local_58 < (BYTE *)((long)ip + (3 - uVar10)))) {
              puVar20 = ip;
              while (ip = puVar20,
                    *(char *)((long)puVar20 - 1) == *(char *)((long)puVar20 + (2 - uVar10))) {
                ip = (ulong *)((long)puVar20 - 1);
                uVar13 = uVar13 + 1;
                if ((ip <= src) ||
                   (pBVar21 = (BYTE *)((long)puVar20 + (2 - uVar10)), puVar20 = ip,
                   pBVar21 <= local_58)) break;
              }
            }
            uVar12 = (ulong)((int)uVar10 - 3);
            uVar8 = uVar7;
          }
          goto LAB_001d88fb;
        }
        uVar12 = (long)ip - (long)src;
        ip = (ulong *)((long)ip + (uVar12 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar12);
        uVar13 = uVar8;
      }
      else {
        puVar20 = (ulong *)((long)ip + 5);
        puVar5 = (ulong *)((long)ip + (5 - uVar7));
        puVar19 = puVar20;
        if (puVar20 < puVar18) {
          uVar10 = *puVar20 ^ *puVar5;
          uVar13 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar13 = uVar13 >> 3 & 0x1fffffff;
          if (*puVar5 == *puVar20) {
            puVar19 = (ulong *)((long)ip + 0xd);
            puVar5 = (ulong *)((long)ip + (0xd - uVar7));
            do {
              if (puVar18 <= puVar19) goto LAB_001d88ab;
              uVar7 = *puVar5;
              uVar10 = *puVar19;
              uVar11 = uVar10 ^ uVar7;
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (long)puVar19 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar20);
              puVar19 = puVar19 + 1;
              puVar5 = puVar5 + 1;
            } while (uVar7 == uVar10);
          }
        }
        else {
LAB_001d88ab:
          if ((puVar19 < local_48) && ((int)*puVar5 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar5 = (ulong *)((long)puVar5 + 4);
          }
          if ((puVar19 < local_50) && ((short)*puVar5 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar5 = (ulong *)((long)puVar5 + 2);
          }
          if (puVar19 < puVar16) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar5 == (char)*puVar19));
          }
          uVar13 = (long)puVar19 - (long)puVar20;
        }
        uVar13 = uVar13 + 4;
        uVar10 = 1;
        ip = (ulong *)((long)ip + 1);
LAB_001d88fb:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001d8d97:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001d8df4:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar7 = (long)ip - (long)src;
        puVar20 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar20 + uVar7)) {
LAB_001d8db6:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (puVar16 < ip) {
LAB_001d8dd5:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_40 < ip) {
          local_5c = (uint)uVar8;
          ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)src,(BYTE *)ip,(BYTE *)local_40);
          uVar8 = (ulong)local_5c;
          puVar16 = local_80;
          puVar18 = local_88;
        }
        else {
          uVar11 = *(ulong *)((long)src + 8);
          *puVar20 = *src;
          puVar20[1] = uVar11;
          if (0x10 < uVar7) {
            pBVar21 = seqStore->lit;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar21 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar11 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar11;
            if (0x20 < (long)uVar7) {
              lVar6 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar6 + 0x20);
                uVar4 = puVar2[1];
                pBVar1 = pBVar21 + lVar6 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar4;
                puVar2 = (undefined8 *)((long)src + lVar6 + 0x30);
                uVar4 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar4;
                lVar6 = lVar6 + 0x20;
              } while (pBVar1 + 0x20 < pBVar21 + uVar7);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar7;
        if (0xffff < uVar7) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar3 = seqStore->sequences;
        psVar3->litLength = (U16)uVar7;
        psVar3->offBase = (U32)uVar10;
        if (uVar13 < 3) {
LAB_001d8e13:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar13 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001d8e32:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(uVar13 - 3);
        seqStore->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        ip = (ulong *)((long)ip + uVar13);
        uVar7 = uVar12;
        uVar13 = uVar8;
        src = ip;
        if (((int)uVar8 != 0) && (ip <= local_78)) {
          while (uVar10 = uVar12, uVar7 = uVar10, uVar13 = uVar8, src = ip,
                (int)*ip == *(int *)((long)ip - uVar8)) {
            puVar20 = (ulong *)((long)ip + 4);
            puVar5 = (ulong *)((long)ip + (4 - uVar8));
            puVar19 = puVar20;
            if (puVar20 < puVar18) {
              uVar12 = *puVar20 ^ *puVar5;
              uVar7 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              uVar7 = uVar7 >> 3 & 0x1fffffff;
              if (*puVar5 == *puVar20) {
                puVar19 = (ulong *)((long)ip + 0xc);
                puVar5 = (ulong *)((long)ip + (0xc - uVar8));
                do {
                  if (puVar18 <= puVar19) goto LAB_001d8b1f;
                  uVar12 = *puVar5;
                  uVar13 = *puVar19;
                  uVar11 = uVar13 ^ uVar12;
                  uVar7 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                    }
                  }
                  uVar7 = (long)puVar19 + ((uVar7 >> 3 & 0x1fffffff) - (long)puVar20);
                  puVar19 = puVar19 + 1;
                  puVar5 = puVar5 + 1;
                } while (uVar12 == uVar13);
              }
            }
            else {
LAB_001d8b1f:
              if ((puVar19 < local_48) && ((int)*puVar5 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar5 = (ulong *)((long)puVar5 + 4);
              }
              if ((puVar19 < local_50) && ((short)*puVar5 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar5 = (ulong *)((long)puVar5 + 2);
              }
              if (puVar19 < puVar16) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar5 == (char)*puVar19));
              }
              uVar7 = (long)puVar19 - (long)puVar20;
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001d8d97;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001d8df4;
            puVar20 = (ulong *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < puVar20) goto LAB_001d8db6;
            if (puVar16 < ip) goto LAB_001d8dd5;
            if (local_40 < ip) {
              ZSTD_safecopyLiterals((BYTE *)puVar20,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_40);
              puVar16 = local_80;
              puVar18 = local_88;
            }
            else {
              uVar12 = ip[1];
              *puVar20 = *ip;
              puVar20[1] = uVar12;
            }
            psVar3 = seqStore->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (uVar7 + 4 < 3) goto LAB_001d8e13;
            if (0xffff < uVar7 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001d8e32;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(uVar7 + 1);
            seqStore->sequences = psVar3 + 1;
            ip = (ulong *)((long)ip + uVar7 + 4);
            uVar7 = uVar8;
            uVar13 = uVar10;
            src = ip;
            if (((int)uVar10 == 0) || (uVar12 = uVar8, uVar8 = uVar10, local_78 < ip)) break;
          }
        }
      }
      uVar15 = (uint)uVar13;
      uVar14 = (uint)uVar7;
      uVar8 = uVar13;
    } while (ip < local_78);
  }
  if (local_6c <= local_68) {
    local_6c = 0;
  }
  uVar9 = local_6c;
  if (uVar14 != 0) {
    uVar9 = local_64;
  }
  if (local_64 <= local_68) {
    uVar9 = local_6c;
    local_64 = 0;
  }
  if (uVar14 != 0) {
    local_64 = uVar14;
  }
  if (uVar15 != 0) {
    uVar9 = uVar15;
  }
  *local_38 = local_64;
  local_38[1] = uVar9;
  return (long)puVar16 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_noDict);
}